

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O1

void duckdb::ListSortFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  vector<duckdb::LogicalType,_true> *types;
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong *puVar3;
  long lVar4;
  unsigned_long *puVar5;
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ClientContext *pCVar9;
  bool bVar10;
  uint uVar11;
  reference pvVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  BoundFunctionExpression *pBVar14;
  pointer pFVar15;
  BufferManager *buffer_manager_p;
  idx_t iVar16;
  Vector *pVVar17;
  vector<duckdb::LogicalType,_true> *payload_types;
  list_entry_t *plVar18;
  reference this;
  pointer pSVar19;
  type sorted_data;
  Allocator *allocator;
  Vector *pVVar20;
  long *plVar21;
  idx_t iVar22;
  ulong uVar23;
  ulong index;
  idx_t iVar24;
  idx_t idx_in_entry;
  ulong uVar25;
  bool data_to_sort;
  idx_t local_6d0;
  Vector *local_6c8;
  pointer local_6c0;
  ulong local_6b8;
  Vector *local_6b0;
  data_ptr_t local_6a8;
  PayloadScanner scanner;
  SelectionVector sel_sorted;
  SelectionVector sel;
  LogicalType local_630;
  LogicalType local_618;
  LogicalType local_600;
  Vector result_vector;
  UnifiedVectorFormat lists_data;
  DataChunk result_chunk;
  Vector sort_result_vec;
  Vector payload_vector;
  Vector lists_indices;
  LocalSortState local_sort_state;
  GlobalSortState global_sort_state;
  
  local_6d0 = args->count;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::SetVectorType(result,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(result);
  if ((pvVar12->type).id_ == SQLNULL) {
    if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_sort_state._0_8_ =
           (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&global_sort_state,(unsigned_long *)&local_sort_state);
      uVar7 = global_sort_state.lock.super___mutex_base._M_mutex.__align;
      pCVar9 = global_sort_state.context;
      global_sort_state.context = (ClientContext *)0x0;
      global_sort_state.lock.super___mutex_base._M_mutex.__align = 0;
      p_Var2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pCVar9;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (global_sort_state.lock.super___mutex_base._M_mutex.__align != 0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   global_sort_state.lock.super___mutex_base._M_mutex.__align);
      }
      pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar13->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    *puVar3 = *puVar3 & 0xfffffffffffffffe;
  }
  else {
    pBVar14 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                        (&state->expr->super_BaseExpression);
    pFVar15 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator->(&pBVar14->bind_info);
    buffer_manager_p =
         BufferManager::GetBufferManager((ClientContext *)pFVar15[0xf]._vptr_FunctionData);
    GlobalSortState::GlobalSortState
              (&global_sort_state,(ClientContext *)pFVar15[0xf]._vptr_FunctionData,
               (vector<duckdb::BoundOrderByNode,_true> *)(pFVar15 + 0x1b),
               (RowLayout *)(pFVar15 + 0x10));
    LocalSortState::LocalSortState(&local_sort_state);
    LocalSortState::Initialize(&local_sort_state,&global_sort_state,buffer_manager_p);
    cVar1 = *(char *)&pFVar15[8]._vptr_FunctionData;
    local_6c0 = pFVar15;
    if (cVar1 == '\x01') {
      LogicalType::LogicalType(&local_600,&pvVar12->type);
      Vector::Vector(&sort_result_vec,&local_600,0x800);
    }
    else {
      Vector::Vector(&sort_result_vec,result);
    }
    if (cVar1 != '\0') {
      LogicalType::~LogicalType(&local_600);
    }
    VectorOperations::Copy(pvVar12,&sort_result_vec,local_6d0,0,0);
    iVar16 = ListVector::GetListSize(&sort_result_vec);
    pVVar17 = ListVector::GetEntry(&sort_result_vec);
    UnifiedVectorFormat::UnifiedVectorFormat(&lists_data);
    Vector::ToUnifiedFormat(&sort_result_vec,local_6d0,&lists_data);
    local_6a8 = lists_data.data;
    LogicalType::LogicalType(&local_618,USMALLINT);
    Vector::Vector(&lists_indices,&local_618,0x800);
    LogicalType::~LogicalType(&local_618);
    LogicalType::LogicalType(&local_630,UINTEGER);
    Vector::Vector(&payload_vector,&local_630,0x800);
    LogicalType::~LogicalType(&local_630);
    SelectionVector::SelectionVector(&sel,0x800);
    data_to_sort = false;
    local_6b8 = 0;
    local_6c8 = result;
    local_6b0 = pVVar17;
    if (local_6d0 == 0) {
      iVar24 = 0;
      iVar22 = 0;
    }
    else {
      types = (vector<duckdb::LogicalType,_true> *)(local_6c0 + 9);
      payload_types = (vector<duckdb::LogicalType,_true> *)(local_6c0 + 0xc);
      iVar24 = 0;
      uVar25 = 0;
      do {
        pVVar17 = local_6c8;
        uVar23 = uVar25;
        if ((lists_data.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(lists_data.sel)->sel_vector[uVar25];
        }
        if ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0)) {
          plVar21 = (long *)(local_6a8 + uVar23 * 0x10);
          if ((plVar21[1] != 0) && (plVar21[1] != 0)) {
            uVar23 = 0;
            do {
              if (iVar24 == 0x800) {
                SinkDataChunk(local_6b0,&sel,0x800,types,payload_types,&payload_vector,
                              &local_sort_state,&data_to_sort,&lists_indices);
                iVar24 = 0;
              }
              lVar4 = *plVar21;
              sel.sel_vector[iVar24] = (sel_t)(lVar4 + uVar23);
              *(short *)(lists_indices.data + iVar24 * 2) = (short)uVar25;
              uVar11 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(lVar4 + uVar23);
              *(uint *)(payload_vector.data + iVar24 * 4) = uVar11;
              iVar24 = iVar24 + 1;
              uVar23 = uVar23 + 1;
            } while (uVar23 < (ulong)plVar21[1]);
            local_6b8 = (ulong)(uint)((int)local_6b8 + (int)uVar23);
          }
        }
        else {
          if ((local_6c8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            result_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(local_6c8->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&result_vector,(unsigned_long *)&result_chunk);
            uVar8 = result_vector.type._0_8_;
            uVar7 = result_vector._0_8_;
            result_vector.vector_type = FLAT_VECTOR;
            result_vector._1_7_ = 0;
            result_vector.type.id_ = INVALID;
            result_vector.type.physical_type_ = ~INVALID;
            result_vector.type._2_6_ = 0;
            p_Var2 = (pVVar17->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (pVVar17->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar7;
            (pVVar17->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            if (result_vector.type._0_8_ != 0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_vector.type._0_8_);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            (local_6c8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar6 = (byte)uVar25 & 0x3f;
          puVar3 = (local_6c8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar25 >> 6);
          *puVar3 = *puVar3 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != local_6d0);
      iVar22 = local_6b8 & 0xffffffff;
    }
    pFVar15 = local_6c0;
    pVVar17 = local_6c8;
    if (iVar24 != 0) {
      SinkDataChunk(local_6b0,&sel,iVar24,(vector<duckdb::LogicalType,_true> *)(local_6c0 + 9),
                    (vector<duckdb::LogicalType,_true> *)(local_6c0 + 0xc),&payload_vector,
                    &local_sort_state,&data_to_sort,&lists_indices);
    }
    if (*(char *)&pFVar15[8]._vptr_FunctionData == '\x01') {
      ListVector::Reserve(pVVar17,iVar16);
      ListVector::SetListSize(pVVar17,iVar16);
      plVar18 = ListVector::GetData(pVVar17);
      switchD_012e1ce8::default(plVar18,local_6a8,local_6d0 << 4);
    }
    if (data_to_sort == true) {
      GlobalSortState::AddLocalState(&global_sort_state,&local_sort_state);
      GlobalSortState::PrepareMergePhase(&global_sort_state);
      SelectionVector::SelectionVector(&sel_sorted,iVar22);
      this = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
             ::operator[](&global_sort_state.sorted_blocks,0);
      pSVar19 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                operator->(this);
      sorted_data = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                    operator*(&pSVar19->payload_data);
      PayloadScanner::PayloadScanner(&scanner,sorted_data,&global_sort_state,true);
      iVar16 = 0;
      do {
        DataChunk::DataChunk(&result_chunk);
        allocator = Allocator::DefaultAllocator();
        DataChunk::Initialize
                  (&result_chunk,allocator,(vector<duckdb::LogicalType,_true> *)(pFVar15 + 0xc),
                   0x800);
        result_chunk.count = 0;
        PayloadScanner::Scan(&scanner,&result_chunk);
        iVar22 = result_chunk.count;
        if (result_chunk.count != 0) {
          pvVar12 = vector<duckdb::Vector,_true>::operator[](&result_chunk.data,0);
          Vector::Vector(&result_vector,pvVar12);
          if (result_chunk.count != 0) {
            iVar24 = 0;
            do {
              sel_sorted.sel_vector[iVar16 + iVar24] = *(sel_t *)(result_vector.data + iVar24 * 4);
              iVar24 = iVar24 + 1;
            } while (result_chunk.count != iVar24);
            iVar16 = iVar16 + iVar24;
          }
          if (result_vector.auxiliary.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (result_vector.auxiliary.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (result_vector.buffer.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (result_vector.buffer.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (result_vector.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
              internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (result_vector.validity.super_TemplatedValidityMask<unsigned_long>.
                       validity_data.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          LogicalType::~LogicalType(&result_vector.type);
        }
        DataChunk::~DataChunk(&result_chunk);
        pVVar20 = local_6b0;
        pVVar17 = local_6c8;
      } while (iVar22 != 0);
      if (*(char *)&local_6c0[8]._vptr_FunctionData == '\x01') {
        pVVar20 = ListVector::GetEntry(local_6c8);
        plVar18 = ListVector::GetData(pVVar17);
        if (local_6d0 != 0) {
          uVar25 = 0;
          do {
            puVar5 = (local_6c8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar5 == (unsigned_long *)0x0) ||
               ((puVar5[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
              uVar23 = plVar18[uVar25].offset;
              if (uVar23 < plVar18[uVar25].length + uVar23) {
                index = uVar23;
                do {
                  iVar16 = index;
                  if (sel_sorted.sel_vector != (sel_t *)0x0) {
                    iVar16 = (idx_t)sel_sorted.sel_vector[index];
                  }
                  Value::BIGINT((Value *)&result_vector,(iVar16 - uVar23) + 1);
                  Vector::SetValue(pVVar20,index,(Value *)&result_vector);
                  Value::~Value((Value *)&result_vector);
                  index = index + 1;
                  uVar23 = plVar18[uVar25].offset;
                } while (index < plVar18[uVar25].length + uVar23);
              }
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != local_6d0);
        }
      }
      else {
        Vector::Slice(local_6b0,&sel_sorted,iVar16);
        Vector::Flatten(pVVar20,iVar16);
      }
      if (scanner.scanner.
          super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
           )0x0) {
        RowDataCollectionScanner::~RowDataCollectionScanner
                  ((RowDataCollectionScanner *)
                   scanner.scanner.
                   super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                   .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl);
        operator_delete((void *)scanner.scanner.
                                super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                                .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>.
                                _M_head_impl);
      }
      pVVar17 = local_6c8;
      scanner.scanner.
      super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl =
           (unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
            )(__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
              )0x0;
      if (scanner.heap.
          super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
          .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
           )0x0) {
        ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                  ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                   ((long)scanner.heap.
                          super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                          .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                   0x38));
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   *)((long)scanner.heap.
                            super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                            .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl
                     + 0x20));
        operator_delete((void *)scanner.heap.
                                super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                                .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>.
                                _M_head_impl);
      }
      scanner.heap.
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl =
           (unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>)
           (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
            )0x0;
      if (scanner.rows.
          super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
          .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
           )0x0) {
        ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                  ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                   ((long)scanner.rows.
                          super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                          .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                   0x38));
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   *)((long)scanner.rows.
                            super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                            .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl
                     + 0x20));
        operator_delete((void *)scanner.rows.
                                super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                                .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>.
                                _M_head_impl);
      }
      if (sel_sorted.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sel_sorted.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    bVar10 = DataChunk::AllConstant(args);
    if (bVar10) {
      Vector::SetVectorType(pVVar17,CONSTANT_VECTOR);
    }
    if (sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (payload_vector.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (payload_vector.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (payload_vector.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (payload_vector.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (payload_vector.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (payload_vector.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&payload_vector.type);
    if (lists_indices.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (lists_indices.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (lists_indices.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (lists_indices.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (lists_indices.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (lists_indices.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&lists_indices.type);
    if (lists_data.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (lists_data.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (sort_result_vec.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sort_result_vec.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (sort_result_vec.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sort_result_vec.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (sort_result_vec.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sort_result_vec.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&sort_result_vec.type);
    LocalSortState::~LocalSortState(&local_sort_state);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              (&global_sort_state.pinned_blocks.
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector(&global_sort_state.heap_blocks.
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             );
    if (global_sort_state.odd_one_out.
        super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>._M_t.
        super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
        super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true,_true>)
        0x0) {
      ::std::default_delete<duckdb::SortedBlock>::operator()
                ((default_delete<duckdb::SortedBlock> *)&global_sort_state.odd_one_out,
                 (SortedBlock *)
                 global_sort_state.odd_one_out.
                 super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                 .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
    }
    global_sort_state.odd_one_out.
    super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>._M_t.
    super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
    super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
         (unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)
         (__uniq_ptr_data<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true,_true>
         )0x0;
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
    ::~vector(&global_sort_state.sorted_blocks_temp.
               super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
             );
    ::std::
    vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
    ::~vector(&global_sort_state.sorted_blocks.
               super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
             );
    if (global_sort_state.payload_layout.offsets.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(global_sort_state.payload_layout.offsets.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &global_sort_state.payload_layout);
    SortLayout::~SortLayout(&global_sort_state.sort_layout);
  }
  return;
}

Assistant:

static void ListSortFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 1 && args.ColumnCount() <= 3);
	auto count = args.size();
	Vector &input_lists = args.data[0];

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto &result_validity = FlatVector::Validity(result);

	if (input_lists.GetType().id() == LogicalTypeId::SQLNULL) {
		result_validity.SetInvalid(0);
		return;
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSortBindData>();

	// initialize the global and local sorting state
	auto &buffer_manager = BufferManager::GetBufferManager(info.context);
	GlobalSortState global_sort_state(info.context, info.orders, info.payload_layout);
	LocalSortState local_sort_state;
	local_sort_state.Initialize(global_sort_state, buffer_manager);

	Vector sort_result_vec = info.is_grade_up ? Vector(input_lists.GetType()) : result;

	// this ensures that we do not change the order of the entries in the input chunk
	VectorOperations::Copy(input_lists, sort_result_vec, count, 0, 0);

	// get the child vector
	auto lists_size = ListVector::GetListSize(sort_result_vec);
	auto &child_vector = ListVector::GetEntry(sort_result_vec);

	// get the lists data
	UnifiedVectorFormat lists_data;
	sort_result_vec.ToUnifiedFormat(count, lists_data);
	auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(lists_data);

	// create the lists_indices vector, this contains an element for each list's entry,
	// the element corresponds to the list's index, e.g. for [1, 2, 4], [5, 4]
	// lists_indices contains [0, 0, 0, 1, 1]
	Vector lists_indices(LogicalType::USMALLINT);
	auto lists_indices_data = FlatVector::GetData<uint16_t>(lists_indices);

	// create the payload_vector, this is just a vector containing incrementing integers
	// this will later be used as the 'new' selection vector of the child_vector, after
	// rearranging the payload according to the sorting order
	Vector payload_vector(LogicalType::UINTEGER);
	auto payload_vector_data = FlatVector::GetData<uint32_t>(payload_vector);

	// selection vector pointing to the data of the child vector,
	// used for slicing the child_vector correctly
	SelectionVector sel(STANDARD_VECTOR_SIZE);

	idx_t offset_lists_indices = 0;
	uint32_t incr_payload_count = 0;
	bool data_to_sort = false;

	for (idx_t i = 0; i < count; i++) {
		auto lists_index = lists_data.sel->get_index(i);
		const auto &list_entry = list_entries[lists_index];

		// nothing to do for this list
		if (!lists_data.validity.RowIsValid(lists_index)) {
			result_validity.SetInvalid(i);
			continue;
		}

		// empty list, no sorting required
		if (list_entry.length == 0) {
			continue;
		}

		for (idx_t child_idx = 0; child_idx < list_entry.length; child_idx++) {
			// lists_indices vector is full, sink
			if (offset_lists_indices == STANDARD_VECTOR_SIZE) {
				SinkDataChunk(&child_vector, sel, offset_lists_indices, info.types, info.payload_types, payload_vector,
				              local_sort_state, data_to_sort, lists_indices);
				offset_lists_indices = 0;
			}

			auto source_idx = list_entry.offset + child_idx;
			sel.set_index(offset_lists_indices, source_idx);
			lists_indices_data[offset_lists_indices] = UnsafeNumericCast<uint16_t>(i);
			payload_vector_data[offset_lists_indices] = NumericCast<uint32_t>(source_idx);
			offset_lists_indices++;
			incr_payload_count++;
		}
	}

	if (offset_lists_indices != 0) {
		SinkDataChunk(&child_vector, sel, offset_lists_indices, info.types, info.payload_types, payload_vector,
		              local_sort_state, data_to_sort, lists_indices);
	}

	if (info.is_grade_up) {
		ListVector::Reserve(result, lists_size);
		ListVector::SetListSize(result, lists_size);
		auto result_data = ListVector::GetData(result);
		memcpy(result_data, list_entries, count * sizeof(list_entry_t));
	}

	if (data_to_sort) {
		// add local state to global state, which sorts the data
		global_sort_state.AddLocalState(local_sort_state);
		global_sort_state.PrepareMergePhase();

		// selection vector that is to be filled with the 'sorted' payload
		SelectionVector sel_sorted(incr_payload_count);
		idx_t sel_sorted_idx = 0;

		// scan the sorted row data
		PayloadScanner scanner(*global_sort_state.sorted_blocks[0]->payload_data, global_sort_state);
		for (;;) {
			DataChunk result_chunk;
			result_chunk.Initialize(Allocator::DefaultAllocator(), info.payload_types);
			result_chunk.SetCardinality(0);
			scanner.Scan(result_chunk);
			if (result_chunk.size() == 0) {
				break;
			}

			// construct the selection vector with the new order from the result vectors
			Vector result_vector(result_chunk.data[0]);
			auto result_data = FlatVector::GetData<uint32_t>(result_vector);
			auto row_count = result_chunk.size();

			for (idx_t i = 0; i < row_count; i++) {
				sel_sorted.set_index(sel_sorted_idx, result_data[i]);
				D_ASSERT(result_data[i] < lists_size);
				sel_sorted_idx++;
			}
		}

		D_ASSERT(sel_sorted_idx == incr_payload_count);
		if (info.is_grade_up) {
			auto &result_entry = ListVector::GetEntry(result);
			auto result_data = ListVector::GetData(result);
			for (idx_t i = 0; i < count; i++) {
				if (!result_validity.RowIsValid(i)) {
					continue;
				}
				for (idx_t j = result_data[i].offset; j < result_data[i].offset + result_data[i].length; j++) {
					auto b = sel_sorted.get_index(j) - result_data[i].offset;
					result_entry.SetValue(j, Value::BIGINT(UnsafeNumericCast<int64_t>(b + 1)));
				}
			}
		} else {
			child_vector.Slice(sel_sorted, sel_sorted_idx);
			child_vector.Flatten(sel_sorted_idx);
		}
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}